

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_ADD(void)

{
  bool bVar1;
  byte bVar2;
  word wVar3;
  Z80Reg ZVar4;
  Z80Reg ZVar5;
  ulong uVar6;
  Z80Reg local_50;
  int iStack_38;
  word b_1;
  word b;
  int e [6];
  int reg2ex;
  Z80Reg reg2;
  Z80Reg reg;
  
  do {
    _iStack_38 = 0xffffffffffffffff;
    e[0] = -1;
    e[1] = -1;
    e[2] = -1;
    e[3] = -1;
    bVar1 = CommonAluOpcode(0x80,&stack0xffffffffffffffc8,true,false);
    if (!bVar1) {
      ZVar4 = GetRegister(&::lp);
      if (ZVar4 == Z80_UNK) {
        return;
      }
      bVar1 = comma(&::lp);
      if (!bVar1) {
        Error("[ADD] Comma expected",(char *)0x0,PASS3);
        return;
      }
      ZVar5 = GetRegister(&::lp);
      if (ZVar4 != Z80_BC) {
        if (ZVar4 != Z80_DE) {
          if (ZVar4 == Z80_HL) {
            if (ZVar5 == Z80_A) {
              if (DAT_001e16a8._4_4_ != 0) {
                _iStack_38 = 0x31000000ed;
              }
            }
            else if ((((ZVar5 == Z80_BC) || (ZVar5 == Z80_DE)) || (ZVar5 == Z80_HL)) ||
                    (ZVar5 == Z80_SP)) {
              _iStack_38 = CONCAT44(_b_1,ZVar5 + ~Z80_MEM_HL);
            }
            else if (DAT_001e16a8._4_4_ != 0) {
              wVar3 = GetWordNoMem(&::lp);
              _iStack_38 = 0x34000000ed;
              e._0_8_ = CONCAT44((int)(uint)wVar3 >> 8,(uint)wVar3) & 0xffffffff000000ff;
              resolveRelocationAndSmartSmc(2,REGULAR);
            }
          }
          else if (ZVar4 == Z80_SP) {
            if (((Options::IsLR35902 & 1) != 0) && (ZVar5 == Z80_UNK)) {
              _iStack_38 = CONCAT44(_b_1,0xe8);
              bVar2 = GetByteNoMem(&::lp,true);
              _iStack_38 = (ulong)CONCAT14(bVar2,iStack_38);
            }
          }
          else if ((ZVar4 == Z80_IX) || (ZVar4 == Z80_IY)) {
            if ((ZVar5 == Z80_BC) || ((ZVar5 == Z80_DE || (ZVar5 == Z80_SP)))) {
              _iStack_38 = CONCAT44(ZVar5 + ~Z80_MEM_HL,ZVar4);
            }
            else if (((ZVar5 == Z80_IX) || (ZVar5 == Z80_IY)) && (ZVar4 == ZVar5)) {
              _iStack_38 = CONCAT44(0x29,ZVar4);
            }
          }
          goto LAB_00161bfa;
        }
        if ((((ZVar5 == Z80_BC) || (ZVar5 == Z80_DE)) || ((ZVar5 == Z80_HL || (ZVar5 == Z80_SP))))
           && (bVar1 = Options::noFakes(true), !bVar1)) {
          if ((ZVar5 == Z80_DE) || (local_50 = ZVar5, ZVar5 == Z80_HL)) {
            local_50 = ZVar5 ^ Z80_BC;
          }
          _iStack_38 = 0xfffffffe000000eb;
          e[1] = -2;
          e[0] = local_50 + ~Z80_MEM_HL;
          e[2] = 0xeb;
        }
      }
      if (DAT_001e16a8._4_4_ != 0) {
        if (ZVar5 == Z80_A) {
          _iStack_38 = CONCAT44((ZVar4 == Z80_BC) + 0x32,0xed);
        }
        else if (ZVar5 == Z80_UNK) {
          wVar3 = GetWordNoMem(&::lp);
          _iStack_38 = CONCAT44((ZVar4 == Z80_BC) + 0x35,0xed);
          e._0_8_ = CONCAT44((int)(uint)wVar3 >> 8,(uint)wVar3) & 0xffffffff000000ff;
          resolveRelocationAndSmartSmc(2,REGULAR);
        }
      }
    }
LAB_00161bfa:
    EmitBytes(&stack0xffffffffffffffc8,true);
    uVar6 = (*DAT_001e16b0)(&::lp);
    if ((uVar6 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_ADD() {
		Z80Reg reg, reg2;
		int reg2ex;
		do {
			int e[] { -1, -1, -1, -1, -1, -1 };
			if (!CommonAluOpcode(0x80, e, true, false)) {	// handle common 8-bit variants
				// add hl|ixy|bc|de|sp,... variants
				reg = GetRegister(lp);	if (Z80_UNK == reg) break;
				if (!comma(lp)) {
					Error("[ADD] Comma expected");
					break;
				}
				reg2 = GetRegister(lp);
				switch (reg) {
				case Z80_HL:
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						e[0] = 0x09 + reg2 - Z80_BC; break;
					case Z80_A:
						if(!Options::syx.IsNextEnabled) break;
						e[0] = 0xED; e[1] = 0x31; break;
					default:
						if(!Options::syx.IsNextEnabled) break;
						word b = GetWordNoMem(lp);
						e[0] = 0xED; e[1] = 0x34 ;
						e[2] = b & 255; e[3] = (b >> 8);
						resolveRelocationAndSmartSmc(2);
						break;
					}
					break;
				case Z80_IX:
				case Z80_IY:
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_SP:
						e[0] = reg; e[1] = 0x09 + reg2 - Z80_BC; break;
					case Z80_IX:
					case Z80_IY:
						if (reg != reg2) break;
						e[0] = reg; e[1] = 0x29; break;
					default:
						break;
					}
					break;
				case Z80_DE:	// fake add de,bc|de|hl|sp
					switch (reg2) {
					case Z80_BC:	case Z80_DE:	case Z80_HL:	case Z80_SP:
						if (Options::noFakes()) break;
						reg2ex = (Z80_DE == reg2 || Z80_HL == reg2) ? (reg2^0x10) : reg2;
						e[0] = 0xEB;
						e[1] = INSTRUCTION_START_MARKER; e[2] = 0x09 + reg2ex - Z80_BC;
						e[3] = INSTRUCTION_START_MARKER; e[4] = 0xEB;
						break;
					default: break;
					}
					//continue into `case Z80_BC` for Z80N variants
				case Z80_BC:
					if (!Options::syx.IsNextEnabled) break;   // DE|BC is valid first operand only for Z80N
					if (Z80_A == reg2) {
						e[0] = 0xED; e[1] = 0x32 + (Z80_BC == reg);
					} else if (Z80_UNK == reg2) {
						word b = GetWordNoMem(lp);
						e[0] = 0xED; e[1] = 0x35 + (Z80_BC == reg);
						e[2] = b & 255; e[3] = (b >> 8);
						resolveRelocationAndSmartSmc(2);
					}
					break;
				case Z80_SP:			// Sharp LR35902 "add sp,r8"
					if (!Options::IsLR35902 || Z80_UNK != reg2) break;
					e[0] = 0xE8;
					e[1] = GetByteNoMem(lp, true);
					break;
				default:	break;		// unreachable (already validated by `CommonAluOpcode` call)
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}